

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseName(xmlParserCtxtPtr ctxt)

{
  ulong uVar1;
  xmlChar *pxVar2;
  int iVar3;
  bool bVar4;
  size_t maxLength;
  size_t count;
  xmlChar *ret;
  xmlChar *in;
  xmlParserCtxtPtr ctxt_local;
  
  iVar3 = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar3 = 10000000;
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  ret = ctxt->input->cur;
  if ((((0x60 < *ret) && (*ret < 0x7b)) || ((0x40 < *ret && (*ret < 0x5b)))) ||
     ((*ret == 0x5f || (*ret == 0x3a)))) {
    do {
      ret = ret + 1;
      if (((*ret < 0x61) || (bVar4 = true, 0x7a < *ret)) &&
         ((((*ret < 0x41 || (bVar4 = true, 0x5a < *ret)) &&
           ((*ret < 0x30 || (bVar4 = true, 0x39 < *ret)))) &&
          (((bVar4 = true, *ret != '_' && (bVar4 = true, *ret != '-')) &&
           (bVar4 = true, *ret != ':')))))) {
        bVar4 = *ret == '.';
      }
    } while (bVar4);
    if ((*ret != '\0') && (*ret < 0x80)) {
      uVar1 = (long)ret - (long)ctxt->input->cur;
      if ((ulong)(long)iVar3 < uVar1) {
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"Name");
        return (xmlChar *)0x0;
      }
      iVar3 = (int)uVar1;
      pxVar2 = xmlDictLookup(ctxt->dict,ctxt->input->cur,iVar3);
      ctxt->input->cur = ret;
      ctxt->input->col = ctxt->input->col + iVar3;
      if (pxVar2 != (xmlChar *)0x0) {
        return pxVar2;
      }
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlChar *)0x0;
    }
  }
  pxVar2 = xmlParseNameComplex(ctxt);
  return pxVar2;
}

Assistant:

const xmlChar *
xmlParseName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    const xmlChar *ret;
    size_t count = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_TEXT_LENGTH :
                       XML_MAX_NAME_LENGTH;

    GROW;

#ifdef DEBUG
    nbParseName++;
#endif

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_') || (*in == ':')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '-') ||
	       (*in == ':') || (*in == '.'))
	    in++;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if (count > maxLength) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Name");
                return(NULL);
            }
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret == NULL)
	        xmlErrMemory(ctxt, NULL);
	    return(ret);
	}
    }
    /* accelerator for special cases */
    return(xmlParseNameComplex(ctxt));
}